

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O2

void __thiscall cmQtAutoGeneratorMocUic::MocGenerateCompilation(cmQtAutoGeneratorMocUic *this)

{
  FileSystem *this_00;
  Logger *this_01;
  string *filename;
  bool bVar1;
  _Base_ptr p_Var2;
  char cVar3;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  pthread_mutex_t *local_58;
  string content;
  
  local_58 = (pthread_mutex_t *)&this->JobsMutex_;
  std::mutex::lock((mutex *)&local_58->__data);
  if ((this->JobError_ == false) && ((this->Moc_).Enabled == true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&content,"// This file is autogenerated. Changes will be overwritten.\n",
               (allocator<char> *)&local_78);
    if ((this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__cxx11::string::append((char *)&content);
      std::__cxx11::string::append((char *)&content);
    }
    else {
      for (p_Var2 = (this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &(this->MocAutoFiles_)._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        std::__cxx11::string::append((char *)&content);
        cVar3 = (char)&content;
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::append((string *)&content);
        std::__cxx11::string::push_back(cVar3);
        std::__cxx11::string::push_back(cVar3);
      }
    }
    filename = &(this->Moc_).CompFileAbs;
    this_00 = &(this->super_cmQtAutoGenerator).FileSys_;
    bVar1 = cmQtAutoGenerator::FileSystem::FileDiffers(this_00,filename,&content);
    if (bVar1) {
      this_01 = &(this->super_cmQtAutoGenerator).Logger_;
      if ((this->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
        std::operator+(&local_78,"Generating MOC compilation ",filename);
        cmQtAutoGenerator::Logger::Info(this_01,MOC,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      bVar1 = cmQtAutoGenerator::FileSystem::FileWrite(this_00,MOC,filename,&content);
      if (!bVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"mocs compilation file writing failed",&local_79);
        cmQtAutoGenerator::Logger::ErrorFile(this_01,MOC,filename,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        RegisterJobError(this);
      }
    }
    else if (this->MocAutoFileUpdated_ == true) {
      if ((this->super_cmQtAutoGenerator).Logger_.Verbosity_ != 0) {
        std::operator+(&local_78,"Touching mocs compilation ",filename);
        cmQtAutoGenerator::Logger::Info(&(this->super_cmQtAutoGenerator).Logger_,MOC,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      cmQtAutoGenerator::FileSystem::Touch(this_00,filename,false);
    }
    std::__cxx11::string::~string((string *)&content);
  }
  pthread_mutex_unlock(local_58);
  return;
}

Assistant:

void cmQtAutoGeneratorMocUic::MocGenerateCompilation()
{
  std::lock_guard<std::mutex> mocLock(JobsMutex_);
  if (!JobError_ && Moc().Enabled) {
    // Write mocs compilation build file
    {
      // Compose mocs compilation file content
      std::string content =
        "// This file is autogenerated. Changes will be overwritten.\n";
      if (MocAutoFiles_.empty()) {
        // Placeholder content
        content += "// No files found that require moc or the moc files are "
                   "included\n";
        content += "enum some_compilers { need_more_than_nothing };\n";
      } else {
        // Valid content
        char const sbeg = Base().MultiConfig ? '<' : '"';
        char const send = Base().MultiConfig ? '>' : '"';
        for (std::string const& mocfile : MocAutoFiles_) {
          content += "#include ";
          content += sbeg;
          content += mocfile;
          content += send;
          content += '\n';
        }
      }

      std::string const& compAbs = Moc().CompFileAbs;
      if (FileSys().FileDiffers(compAbs, content)) {
        // Actually write mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Generating MOC compilation " + compAbs);
        }
        if (!FileSys().FileWrite(GenT::MOC, compAbs, content)) {
          Log().ErrorFile(GenT::MOC, compAbs,
                          "mocs compilation file writing failed");
          RegisterJobError();
          return;
        }
      } else if (MocAutoFileUpdated_) {
        // Only touch mocs compilation file
        if (Log().Verbose()) {
          Log().Info(GenT::MOC, "Touching mocs compilation " + compAbs);
        }
        FileSys().Touch(compAbs);
      }
    }
    // Write mocs compilation wrapper file
    if (Base().MultiConfig) {
    }
  }
}